

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

SynFunctionDefinition *
GetGenericFunctionDefinition(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  int optimizationLevel;
  Lexeme *allocator;
  ParseContext *this;
  SynFunctionDefinition *pSVar1;
  ArrayView<InplaceStr> activeImports;
  undefined1 local_38 [12];
  ParseContext *local_28;
  ParseContext *parser;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  parser = (ParseContext *)function;
  if ((function->definition == (SynFunctionDefinition *)0x0) &&
     (function->delayedDefinition != (Lexeme *)0x0)) {
    function_local = (FunctionData *)source;
    source_local = (SynBase *)ctx;
    this = ExpressionContext::get<ParseContext>(ctx);
    allocator = source_local[0x229].begin;
    optimizationLevel = *(int *)&source_local->_vptr_SynBase;
    ArrayView<InplaceStr>::ArrayView((ArrayView<InplaceStr> *)local_38);
    activeImports._12_4_ = 0;
    activeImports.data = (InplaceStr *)local_38._0_8_;
    activeImports.count = local_38._8_4_;
    ParseContext::ParseContext(this,(Allocator *)allocator,optimizationLevel,activeImports);
    this->currentLexeme = *(Lexeme **)((parser->lexer).lexems.little + 0xd);
    local_28 = this;
    ImportModuleNamespaces
              (this,*(Lexeme **)((parser->lexer).lexems.little + 0xd),
               *(ByteCode **)(parser->moduleRoot + 0x20));
    pSVar1 = ParseFunctionDefinition(local_28);
    *(SynFunctionDefinition **)&(parser->lexer).lexems.little[0xc].column = pSVar1;
    if (*(long *)&(parser->lexer).lexems.little[0xc].column == 0) {
      anon_unknown.dwarf_e7629::Stop
                ((ExpressionContext *)source_local,(SynBase *)function_local,
                 "ERROR: failed to import generic function \'%.*s\' body",
                 (ulong)(uint)((int)*(undefined8 *)
                                     (*(long *)&(parser->lexer).lexems.little[0].length + 0x48) -
                              (int)*(undefined8 *)
                                    (*(long *)&(parser->lexer).lexems.little[0].length + 0x40)),
                 *(undefined8 *)(*(long *)&(parser->lexer).lexems.little[0].length + 0x40));
    }
  }
  return *(SynFunctionDefinition **)&(parser->lexer).lexems.little[0xc].column;
}

Assistant:

SynFunctionDefinition* GetGenericFunctionDefinition(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	if(!function->definition && function->delayedDefinition)
	{
		ParseContext *parser = new (ctx.get<ParseContext>()) ParseContext(ctx.allocator, ctx.optimizationLevel, ArrayView<InplaceStr>());

		parser->currentLexeme = function->delayedDefinition;

		ImportModuleNamespaces(*parser, function->delayedDefinition, function->importModule->bytecode);

		function->definition = ParseFunctionDefinition(*parser);

		if(!function->definition)
			Stop(ctx, source, "ERROR: failed to import generic function '%.*s' body", FMT_ISTR(function->name->name));
	}

	return function->definition;
}